

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O3

void helper_pclmulqdq_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,uint32_t ctrl)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar6 = *(ulong *)((long)s + (ulong)(ctrl >> 1 & 8));
  if (uVar6 == 0) {
    uVar2 = 0;
    uVar3 = 0;
  }
  else {
    uVar4 = d->_q_ZMMReg[ctrl & 1];
    uVar3 = 0;
    uVar2 = 0;
    uVar5 = 0;
    do {
      uVar7 = -(ulong)((uint)uVar6 & 1);
      uVar2 = uVar2 ^ uVar7 & uVar5;
      uVar3 = uVar3 ^ uVar7 & uVar4;
      uVar5 = uVar5 << 1 | uVar4 >> 0x3f;
      uVar4 = uVar4 * 2;
      bVar1 = 1 < uVar6;
      uVar6 = uVar6 >> 1;
    } while (bVar1);
  }
  d->_q_ZMMReg[0] = uVar3;
  d->_q_ZMMReg[1] = uVar2;
  return;
}

Assistant:

void glue(helper_pclmulqdq, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                    uint32_t ctrl)
{
    uint64_t ah, al, b, resh, resl;

    ah = 0;
    al = d->Q((ctrl & 1) != 0);
    b = s->Q((ctrl & 16) != 0);
    resh = resl = 0;

    while (b) {
        if (b & 1) {
            resl ^= al;
            resh ^= ah;
        }
        ah = (ah << 1) | (al >> 63);
        al <<= 1;
        b >>= 1;
    }

    d->Q(0) = resl;
    d->Q(1) = resh;
}